

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxNumConstrFails(void *arkode_mem,int maxfails)

{
  int in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxNumConstrFails",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_ESI < 1) {
      *(undefined4 *)(in_RDI + 0x1c4) = 10;
    }
    else {
      *(int *)(in_RDI + 0x1c4) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxNumConstrFails(void *arkode_mem, int maxfails)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxNumConstrFails", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing maxfails = 0 sets the default, otherwise set to input */
  if (maxfails <= 0)
    ark_mem->maxconstrfails = MAXCONSTRFAILS;
  else
    ark_mem->maxconstrfails = maxfails;

  return(ARK_SUCCESS);
}